

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Aig_Man_t * Aig_ManChoiceConstructive(Vec_Ptr_t *vAigs,int fVerbose)

{
  int iVar1;
  Aig_Man_t *pThis;
  Aig_Man_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *vPios;
  Tim_Man_t *pTVar5;
  long lVar6;
  long lVar7;
  
  if (0 < vAigs->nSize) {
    pAVar4 = (Aig_Man_t *)*vAigs->pArray;
    pAVar2 = Aig_ManDupOrdered(pAVar4);
    if (pAVar2->pReprs != (Aig_Obj_t **)0x0) {
      __assert_fail("pNew->pReprs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                    ,0x625,"Aig_Man_t *Aig_ManChoiceConstructive(Vec_Ptr_t *, int)");
    }
    iVar1 = vAigs->nSize;
    lVar6 = (long)pAVar2->vObjs->nSize * (long)iVar1;
    pAVar2->nReprsAlloc = (int)lVar6;
    lVar7 = 1;
    ppAVar3 = (Aig_Obj_t **)calloc(1,lVar6 * 8);
    pAVar2->pReprs = ppAVar3;
    if (1 < (long)iVar1) {
      do {
        pThis = (Aig_Man_t *)vAigs->pArray[lVar7];
        Aig_ManChoiceConstructiveOne(pAVar2,pAVar4,pThis);
        lVar7 = lVar7 + 1;
        pAVar4 = pThis;
      } while (lVar7 < vAigs->nSize);
    }
    pAVar4 = Aig_ManRehash(pAVar2);
    Aig_ManMarkValidChoices(pAVar4);
    if (0 < vAigs->nSize) {
      vPios = Aig_ManOrderPios(pAVar4,(Aig_Man_t *)*vAigs->pArray);
      pAVar2 = Aig_ManDupDfsGuided(pAVar4,vPios);
      Aig_ManStop(pAVar4);
      if (vPios->pArray != (void **)0x0) {
        free(vPios->pArray);
      }
      free(vPios);
      if (0 < vAigs->nSize) {
        pTVar5 = *(Tim_Man_t **)((long)*vAigs->pArray + 0x160);
        if (pTVar5 != (Tim_Man_t *)0x0) {
          pTVar5 = Tim_ManDup(pTVar5,0);
          pAVar2->pManTime = pTVar5;
        }
        Aig_ManChoiceLevel(pAVar2);
        return pAVar2;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Aig_ManChoiceConstructive( Vec_Ptr_t * vAigs, int fVerbose )
{
    Vec_Ptr_t * vPios;
    Aig_Man_t * pNew, * pThis, * pPrev, * pTemp;
    int i;
    // start AIG with choices
    pPrev = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    pNew = Aig_ManDupOrdered( pPrev );
    // create room for equivalent nodes and representatives
    assert( pNew->pReprs == NULL );
    pNew->nReprsAlloc = Vec_PtrSize(vAigs) * Aig_ManObjNumMax(pNew);
    pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, pNew->nReprsAlloc );
    memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * pNew->nReprsAlloc );
    // add other AIGs one by one
    Vec_PtrForEachEntryStart( Aig_Man_t *, vAigs, pThis, i, 1 )
    {
        Aig_ManChoiceConstructiveOne( pNew, pPrev, pThis );
        pPrev = pThis;
    }
    // derive the result of choicing
    pNew = Aig_ManRehash( pNew );
    // create the equivalent nodes lists
    Aig_ManMarkValidChoices( pNew );
    // reconstruct the network
    vPios = Aig_ManOrderPios( pNew, (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 ) );
    pNew = Aig_ManDupDfsGuided( pTemp = pNew, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );
    // duplicate the timing manager
    pTemp = (Aig_Man_t *)Vec_PtrEntry( vAigs, 0 );
    if ( pTemp->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)pTemp->pManTime, 0 );
    // reset levels
    Aig_ManChoiceLevel( pNew );
    return pNew;
}